

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedServiceTest_CallMethod_Test::
GeneratedServiceTest_CallMethod_Test(GeneratedServiceTest_CallMethod_Test *this)

{
  GeneratedServiceTest_CallMethod_Test *this_local;
  
  GeneratedServiceTest::GeneratedServiceTest(&this->super_GeneratedServiceTest);
  (this->super_GeneratedServiceTest).super_Test._vptr_Test =
       (_func_int **)&PTR__GeneratedServiceTest_CallMethod_Test_02a04ab8;
  return;
}

Assistant:

TEST_F(GENERATED_SERVICE_TEST_NAME, CallMethod) {
  // Test that CallMethod() works.

  // Call Foo() via CallMethod().
  mock_service_.CallMethod(foo_, &mock_controller_,
                           &foo_request_, &foo_response_, done_.get());

  ASSERT_TRUE(mock_service_.called_);

  EXPECT_EQ("Foo"            , mock_service_.method_    );
  EXPECT_EQ(&mock_controller_, mock_service_.controller_);
  EXPECT_EQ(&foo_request_    , mock_service_.request_   );
  EXPECT_EQ(&foo_response_   , mock_service_.response_  );
  EXPECT_EQ(done_.get()      , mock_service_.done_      );

  // Try again, but call Bar() instead.
  mock_service_.Reset();
  mock_service_.CallMethod(bar_, &mock_controller_,
                           &bar_request_, &bar_response_, done_.get());

  ASSERT_TRUE(mock_service_.called_);
  EXPECT_EQ("Bar", mock_service_.method_);
}